

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

void __thiscall
embree::SceneGraph::QuadMeshNode::QuadMeshNode
          (QuadMeshNode *this,Ref<embree::SceneGraph::MaterialNode> *material,BBox1f time_range,
          size_t numTimeSteps)

{
  ulong in_RDX;
  long *in_RSI;
  undefined8 *in_RDI;
  undefined8 in_XMM0_Qa;
  size_t i;
  size_t i_2;
  size_t i_1;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  Node *in_stack_fffffffffffffed0;
  undefined1 local_d8 [8];
  ulong local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  ulong local_b8;
  ulong local_a0;
  undefined8 local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  long *local_60;
  ulong local_40;
  undefined1 *local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined1 *local_20;
  
  local_a0 = in_RDX;
  local_88 = in_XMM0_Qa;
  Node::Node(in_stack_fffffffffffffed0,(bool)in_stack_fffffffffffffecf);
  *in_RDI = &PTR__QuadMeshNode_005ff408;
  in_RDI[0xd] = local_88;
  std::
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  ::vector((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            *)0x1ea1a1);
  std::
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  ::vector((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            *)0x1ea1b7);
  std::vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>::vector
            ((vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)0x1ea1cd);
  std::
  vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
  ::vector((vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
            *)0x1ea1e3);
  local_60 = in_RDI + 0x1a;
  *local_60 = *in_RSI;
  if (*local_60 != 0) {
    (**(code **)(*(long *)*local_60 + 0x10))();
  }
  for (local_b8 = 0; local_b8 < local_a0; local_b8 = local_b8 + 1) {
    local_80 = local_d8;
    local_d0 = 0;
    local_c8 = 0;
    local_c0 = 0;
    std::
    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
    ::push_back((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                 *)in_stack_fffffffffffffed0,
                (value_type *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
    local_78 = local_d8;
    for (local_40 = 0; local_40 < local_d0; local_40 = local_40 + 1) {
    }
    local_30 = local_c8;
    local_28 = local_c0;
    local_38 = local_78;
    local_20 = local_78;
    alignedFree((void *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
  }
  return;
}

Assistant:

QuadMeshNode (Ref<MaterialNode> material, const BBox1f time_range = BBox1f(0,1), size_t numTimeSteps = 0 ) 
        : Node(true), time_range(time_range), material(material) 
      {
        for (size_t i=0; i<numTimeSteps; i++)
          positions.push_back(avector<Vertex>());
      }